

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v11::basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::move
          (basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *this
          ,basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>
           *other)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  puVar2 = (other->super_buffer<unsigned_int>).ptr_;
  uVar3 = (other->super_buffer<unsigned_int>).size_;
  sVar4 = (other->super_buffer<unsigned_int>).capacity_;
  puVar1 = other->store_;
  if (puVar2 == puVar1) {
    (this->super_buffer<unsigned_int>).ptr_ = this->store_;
    (this->super_buffer<unsigned_int>).capacity_ = sVar4;
    if (uVar3 != 0) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)this->store_ + lVar6) = *(undefined4 *)((long)puVar1 + lVar6);
        lVar6 = lVar6 + 4;
      } while (uVar3 * 4 - lVar6 != 0);
    }
  }
  else {
    (this->super_buffer<unsigned_int>).ptr_ = puVar2;
    (this->super_buffer<unsigned_int>).capacity_ = sVar4;
    (other->super_buffer<unsigned_int>).ptr_ = puVar1;
    (other->super_buffer<unsigned_int>).size_ = 0;
    (other->super_buffer<unsigned_int>).capacity_ = 0;
  }
  if ((this->super_buffer<unsigned_int>).capacity_ < uVar3) {
    (*(this->super_buffer<unsigned_int>).grow_)(&this->super_buffer<unsigned_int>,uVar3);
  }
  uVar5 = (this->super_buffer<unsigned_int>).capacity_;
  if (uVar3 < uVar5) {
    uVar5 = uVar3;
  }
  (this->super_buffer<unsigned_int>).size_ = uVar5;
  return;
}

Assistant:

FMT_CONSTEXPR20 void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      detail::copy<T>(other.store_, other.store_ + size, store_);
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
      other.clear();
    }
    this->resize(size);
  }